

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::appendSpansForContent
          (HTMLGenerator *this,HTMLElement *parent,string_view markdown)

{
  size_type sVar1;
  DelimiterType *pDVar2;
  size_type __n;
  size_type __pos;
  string_view text;
  bool bVar3;
  int iVar4;
  FoundDelimiter *pFVar5;
  FoundDelimiter *__last;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view markdown_00;
  string_view markdown_01;
  basic_string_view<char,_std::char_traits<char>_> part3;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  string local_188 [8];
  string part2;
  basic_string_view<char,_std::char_traits<char>_> part1;
  DelimitedSection range_1;
  FoundDelimiter local_138;
  HTMLElement *local_108;
  size_t sStack_100;
  undefined1 auStack_f8 [8];
  DelimitedSection range;
  DelimiterType *type;
  DelimiterType *__end2;
  DelimiterType *__begin2;
  DelimiterType (*__range2) [4];
  ArrayWithPreallocation<FoundDelimiter,_4UL> found;
  HTMLElement *parent_local;
  string_view markdown_local;
  
  markdown_local._M_len = markdown._M_len;
  parent_local = parent;
  if (appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
      ::delimiterTypes == '\0') {
    iVar4 = __cxa_guard_acquire(&appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
                                 ::delimiterTypes,parent,markdown_local._M_len,markdown._M_str);
    if (iVar4 != 0) {
      std::
      function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
      ::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_,void>
                ((function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
                  *)appendSpansForContent::delimiterTypes,
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7f));
      std::
      function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
                ((function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>
                  *)&appendSpansForContent::delimiterTypes[0].addReplacementElement,
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7e));
      std::
      function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
      ::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_2_,void>
                ((function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
                  *)(appendSpansForContent::delimiterTypes + 1),
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7d));
      std::
      function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)_2_,void>
                ((function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>
                  *)&appendSpansForContent::delimiterTypes[1].addReplacementElement,
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7c));
      std::
      function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
      ::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_,void>
                ((function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
                  *)(appendSpansForContent::delimiterTypes + 2),
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7b));
      std::
      function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)_3_,void>
                ((function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>
                  *)&appendSpansForContent::delimiterTypes[2].addReplacementElement,
                 (anon_class_1_0_00000001 *)((long)found.space + 0x7a));
      std::
      function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
      ::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_,void>
                ((function<soul::HTMLGenerator::DelimitedSection(std::basic_string_view<char,std::char_traits<char>>)>
                  *)(appendSpansForContent::delimiterTypes + 3),
                 (anon_class_1_0_00000001 *)((long)found.space + 0x79));
      std::
      function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>::
      function<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::_lambda(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)_4_,void>
                ((function<void(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)>
                  *)&appendSpansForContent::delimiterTypes[3].addReplacementElement,
                 (anon_class_1_0_00000001 *)(found.space + 0xf));
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
                           ::delimiterTypes);
    }
  }
  ArrayWithPreallocation<FoundDelimiter,_4UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
  for (__end2 = appendSpansForContent::delimiterTypes;
      __end2 != (DelimiterType *)
                &appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
                 ::delimiterTypes; __end2 = __end2 + 1) {
    range.delimiterLength = (size_type)__end2;
    local_108 = parent_local;
    sStack_100 = markdown_local._M_len;
    bVar7._M_str = (char *)markdown_local._M_len;
    bVar7._M_len = (size_t)parent_local;
    std::
    function<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()((DelimitedSection *)auStack_f8,&__end2->findNextMatch,bVar7);
    if ((ulong)auStack_f8 < range.outerStart) {
      local_138.range.delimiterLength = range.outerEnd;
      local_138.range.outerStart = (size_type)auStack_f8;
      local_138.range.outerEnd = range.outerStart;
      local_138.type = (DelimiterType *)range.delimiterLength;
      ArrayWithPreallocation<FoundDelimiter,_4UL>::push_back
                ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2,&local_138);
    }
  }
  bVar3 = ArrayWithPreallocation<FoundDelimiter,_4UL>::empty
                    ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
  if (bVar3) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&parent_local);
    if (!bVar3) {
      text._M_str = (char *)markdown_local._M_len;
      text._M_len = (size_t)parent_local;
      choc::html::HTMLElement::addContent((HTMLElement *)this,text);
    }
  }
  else {
    pFVar5 = ArrayWithPreallocation<FoundDelimiter,_4UL>::begin
                       ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
    __last = ArrayWithPreallocation<FoundDelimiter,_4UL>::end
                       ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
    std::
    sort<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::FoundDelimiter*>
              (pFVar5,__last);
    pFVar5 = ArrayWithPreallocation<FoundDelimiter,_4UL>::front
                       ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
    sVar1 = (pFVar5->range).delimiterLength;
    __n = (pFVar5->range).outerStart;
    __pos = (pFVar5->range).outerEnd;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&parent_local,0,__n);
    markdown_00._M_len = bVar7._M_str;
    part2.field_2._8_8_ = bVar7._M_len;
    local_198 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&parent_local,
                           __n + sVar1,(__pos - __n) + sVar1 * -2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_188,&local_198,(allocator<char> *)((long)&part3._M_str + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&part3._M_str + 7));
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&parent_local,__pos,
                       0xffffffffffffffff);
    part3._M_len = (size_t)bVar7._M_str;
    markdown_00._M_str = (char *)bVar7._M_len;
    appendSpansForContent(this,(HTMLElement *)part2.field_2._8_8_,markdown_00);
    pFVar5 = ArrayWithPreallocation<FoundDelimiter,_4UL>::front
                       ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
    pDVar2 = pFVar5->type;
    __args_1 = (basic_string_view<char,_std::char_traits<char>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view(local_188);
    pcVar6 = __args_1._M_str;
    std::
    function<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&pDVar2->addReplacementElement,(HTMLElement *)this,__args_1);
    markdown_01._M_str = pcVar6;
    markdown_01._M_len = part3._M_len;
    appendSpansForContent(this,(HTMLElement *)bVar7._M_len,markdown_01);
    std::__cxx11::string::~string(local_188);
  }
  ArrayWithPreallocation<FoundDelimiter,_4UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)&__range2);
  return;
}

Assistant:

static void appendSpansForContent (choc::html::HTMLElement& parent, std::string_view markdown)
    {
        static const DelimiterType delimiterTypes[] =
        {
            {
                // `code`
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "`");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addChild ("code").addContent (text);
                }
            },
            {
                // _Emphasis_
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "_");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("em").setInline (true), text);
                }
            },
            {
                // **Bold**
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "**");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("strong").setInline (true), text);
                }
            },
            {
                // Links..
                [] (std::string_view text) -> DelimitedSection
                {
                    for (auto* proto : { "http:", "https:", "file:" })
                    {
                        auto start = text.find (proto);

                        if (start != std::string::npos)
                        {
                            auto end = text.find (' ', start);

                            if (end == std::string_view::npos) end = text.find ('\n', start);
                            if (end == std::string_view::npos) end = text.length();

                            return { start, end, 0 };
                        }
                    }

                    return {};
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addLink (text).addContent (text);
                }
            }
        };

        struct FoundDelimiter
        {
            DelimitedSection range;
            const DelimiterType* type;

            bool operator< (const FoundDelimiter& other) const    { return range.outerStart < other.range.outerStart; }
        };

        ArrayWithPreallocation<FoundDelimiter, 4> found;

        for (auto& type : delimiterTypes)
        {
            auto range = type.findNextMatch (markdown);

            if (range.outerEnd > range.outerStart)
                found.push_back ({ range, &type });
        }

        if (! found.empty())
        {
            std::sort (found.begin(), found.end());
            auto range = found.front().range;

            auto part1 = markdown.substr (0, range.outerStart);
            auto part2 = std::string (markdown.substr (range.outerStart + range.delimiterLength,
                                                       range.outerEnd - range.outerStart - range.delimiterLength * 2));
            auto part3 = markdown.substr (range.outerEnd);

            appendSpansForContent (parent, part1);
            found.front().type->addReplacementElement (parent, part2);
            appendSpansForContent (parent, part3);
            return;
        }

        if (! markdown.empty())
            parent.addContent (markdown);
    }